

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall snestistics::Range::add(Range *this,int v)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = fits(this,v);
  if (bVar2) {
    iVar1 = this->N;
    if (iVar1 == 0) {
      this->first = v;
      iVar3 = v;
    }
    else if (iVar1 == 1) {
      this->step = v - this->first;
      iVar3 = this->first;
    }
    else {
      iVar3 = this->first;
    }
    if (this->step * iVar1 + iVar3 == v) {
      this->N = iVar1 + 1;
    }
    return;
  }
  __assert_fail("fits(v)",
                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/utils.h"
                ,0x90,"void snestistics::Range::add(int)");
}

Assistant:

void add(int v) {
		assert(fits(v));
		if (N==0) first = v;
		if (N==1) { step = v - first; }
		if (first+step*N == v) N++; // Don't increase if we got same
	}